

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_connect(udp_tracker_connection *this)

{
  listen_socket_handle *sock;
  uint32_t uVar1;
  tracker_manager *this_00;
  size_type sVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  ushort uVar5;
  int val;
  int iVar6;
  long lVar7;
  size_t *psVar8;
  byte bVar9;
  array<char,_16UL> *__n;
  endpoint *ep;
  shared_ptr<libtorrent::aux::request_callback> sVar10;
  span<const_char> in;
  span<const_char> p;
  error_code ec;
  string local_c8;
  shared_ptr<libtorrent::aux::request_callback> cb;
  array<char,_16UL> buf;
  time_point local_88 [2];
  service_type *local_78 [2];
  string local_68;
  array<char,_22UL> local_46;
  
  sVar10 = tracker_connection::requester((tracker_connection *)&cb);
  if (this->m_abort == true) {
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> UDP_TRACKER_CONNECT [ skipped, m_abort ]",
                 sVar10.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
  }
  else {
    bVar9 = 0x18;
    lVar7 = 0;
    do {
      buf._M_elems[lVar7] = (char)(0x417 >> (bVar9 & 0x1f));
      lVar7 = lVar7 + 1;
      bVar9 = bVar9 - 8;
    } while (lVar7 != 4);
    bVar9 = 0x18;
    lVar7 = 4;
    do {
      buf._M_elems[lVar7] = (char)(0x27101980 >> (bVar9 & 0x1f));
      bVar9 = bVar9 - 8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    buf._M_elems[8] = '\0';
    buf._M_elems[9] = '\0';
    buf._M_elems[10] = '\0';
    buf._M_elems[0xb] = '\0';
    uVar1 = this->m_transaction_id;
    bVar9 = 0x18;
    lVar7 = 0xc;
    do {
      buf._M_elems[lVar7] = (char)((int)uVar1 >> (bVar9 & 0x1f));
      bVar9 = bVar9 - 8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    sock = &(this->super_tracker_connection).m_req.outgoing_socket;
    this_00 = (this->super_tracker_connection).m_man;
    if ((this->m_hostname)._M_string_length == 0) {
      __n = &buf;
      tracker_manager::send(this_00,(int)sock,&this->m_target,(size_t)__n,0x10);
    }
    else {
      uVar5 = (this->m_target).impl_.data_.v4.sin_port;
      uVar5 = uVar5 << 8 | uVar5 >> 8;
      __n = (array<char,_16UL> *)(ulong)uVar5;
      p.m_len = 0x10;
      p.m_ptr = buf._M_elems;
      tracker_manager::send_hostname
                (this_00,sock,(this->m_hostname)._M_dataplus._M_p,(uint)uVar5,p,&ec,
                 (udp_send_flags_t)0x2);
    }
    this->m_attempts = this->m_attempts + 1;
    if (ec.failed_ == true) {
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        iVar6 = (*(cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_request_callback[6])();
        if ((char)iVar6 != '\0') {
          (*(ec.cat_)->_vptr_error_category[4])(&local_c8,ec.cat_,(ulong)(uint)ec.val_);
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"==> UDP_TRACKER_CONNECT [ failed: %s ]",local_c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
    }
    else {
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        iVar6 = (*(cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_request_callback[6])();
        if ((char)iVar6 != '\0') {
          sVar2 = (this->m_hostname)._M_string_length;
          if (sVar2 == 0) {
            print_endpoint_abi_cxx11_(&local_c8,(aux *)&this->m_target,ep);
          }
          else {
            local_88[0].__d.__r = (duration)local_78;
            pcVar3 = (this->m_hostname)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>((string *)local_88,pcVar3,pcVar3 + sVar2);
            ::std::__cxx11::string::append((char *)local_88);
            uVar5 = (this->m_target).impl_.data_.v4.sin_port;
            to_string(&local_46,(ulong)(ushort)(uVar5 << 8 | uVar5 >> 8));
            psVar8 = (size_t *)::std::__cxx11::string::append((char *)local_88);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            __n = (array<char,_16UL> *)(psVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*psVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__n) {
              local_c8.field_2._M_allocated_capacity = *(undefined8 *)__n->_M_elems;
              local_c8.field_2._8_8_ = psVar8[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *(undefined8 *)__n->_M_elems;
              local_c8._M_dataplus._M_p = (pointer)*psVar8;
            }
            local_c8._M_string_length = psVar8[1];
            *psVar8 = (size_t)__n;
            psVar8[1] = 0;
            *(undefined1 *)(psVar8 + 2) = 0;
          }
          _Var4._M_p = local_c8._M_dataplus._M_p;
          in.m_len = (difference_type)__n;
          in.m_ptr = (char *)0x14;
          to_hex_abi_cxx11_(&local_68,(aux *)&(this->super_tracker_connection).m_req.info_hash,in);
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]",_Var4._M_p,
                     local_68._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,
                            (ulong)(local_68.field_2._M_allocated_capacity + 1));
          }
          if (sVar2 != 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if (local_88[0].__d.__r != (duration)local_78) {
              operator_delete((void *)local_88[0].__d.__r,
                              (ulong)((long)&(local_78[0]->
                                             super_execution_context_service_base<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>
                                             ).super_service._vptr_service + 1));
            }
          }
          if ((sVar2 == 0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      this->m_state = connect;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x2c);
    }
  }
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_connect()
	{
#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
#endif

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb) cb->debug_log("==> UDP_TRACKER_CONNECT [ skipped, m_abort ]");
#endif
			return;
		}

		std::size_t const connect_packet_size = 16;
		std::array<char, connect_packet_size> buf;
		span<char> view = buf;

		TORRENT_ASSERT(m_transaction_id != 0);

		aux::write_uint32(0x417, view);
		aux::write_uint32(0x27101980, view); // connection_id
		aux::write_int32(action_t::connect, view); // action (connect)
		aux::write_int32(m_transaction_id, view); // transaction_id
		TORRENT_ASSERT(view.empty());

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), buf, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}

		++m_attempts;
		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb && cb->should_log())
			{
				cb->debug_log("==> UDP_TRACKER_CONNECT [ failed: %s ]"
					, ec.message().c_str());
			}
#endif
			fail(ec, operation_t::sock_write);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]"
				, m_hostname.empty()
					? print_endpoint(m_target).c_str()
					: (m_hostname + ":" + to_string(m_target.port()).data()).c_str()
				, aux::to_hex(tracker_req().info_hash).c_str());
		}
#endif

		m_state = action_t::connect;
		sent_bytes(16 + 28); // assuming UDP/IP header
	}